

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void splitbill(obj *obj,obj *otmp)

{
  uint uVar1;
  int iVar2;
  monst *mtmp;
  bill_x *pbVar3;
  uint *puVar4;
  monst *shkp;
  long tmp;
  bill_x *bp;
  obj *otmp_local;
  obj *obj_local;
  
  mtmp = shop_keeper(level,u.ushops[0]);
  if ((mtmp == (monst *)0x0) || (iVar2 = inhishop(mtmp), iVar2 == 0)) {
    warning("splitbill: no resident shopkeeper??");
    return;
  }
  pbVar3 = onbill(obj,mtmp,'\0');
  if (pbVar3 == (bill_x *)0x0) {
    warning("splitbill: not on bill?");
    return;
  }
  if (pbVar3->bquan < otmp->quan) {
    warning("Negative quantity on bill??");
  }
  if (pbVar3->bquan == otmp->quan) {
    warning("Zero quantity on bill??");
  }
  pbVar3->bquan = pbVar3->bquan - otmp->quan;
  if (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200) {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffffb;
    return;
  }
  uVar1 = pbVar3->price;
  puVar4 = (uint *)(*(long *)&mtmp[0x1b].mnum +
                   (long)*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) * 0x10);
  *puVar4 = otmp->o_id;
  puVar4[3] = otmp->quan;
  *(undefined1 *)(puVar4 + 1) = 0;
  puVar4[2] = uVar1;
  *(short *)((long)&mtmp[0x1b].misc_worn_check + 2) =
       *(short *)((long)&mtmp[0x1b].misc_worn_check + 2) + 1;
  return;
}

Assistant:

void splitbill(struct obj *obj, struct obj *otmp)
{
	/* otmp has been split off from obj */
	struct bill_x *bp;
	long tmp;
	struct monst *shkp = shop_keeper(level, *u.ushops);

	if (!shkp || !inhishop(shkp)) {
		warning("splitbill: no resident shopkeeper??");
		return;
	}
	bp = onbill(obj, shkp, FALSE);
	if (!bp) {
		warning("splitbill: not on bill?");
		return;
	}
	if (bp->bquan < otmp->quan) {
		warning("Negative quantity on bill??");
	}
	if (bp->bquan == otmp->quan) {
		warning("Zero quantity on bill??");
	}
	bp->bquan -= otmp->quan;

	if (ESHK(shkp)->billct == BILLSZ) otmp->unpaid = 0;
	else {
		tmp = bp->price;
		bp = &(ESHK(shkp)->bill_p[ESHK(shkp)->billct]);
		bp->bo_id = otmp->o_id;
		bp->bquan = otmp->quan;
		bp->useup = 0;
		bp->price = tmp;
		ESHK(shkp)->billct++;
	}
}